

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_metric.hpp
# Opt level: O2

void __thiscall
ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)3>::metric_pair::
metric_pair<std::array<std::__cxx11::string,3ul>const&>
          (metric_pair *this,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
          *first)

{
  atomic<long> *paVar1;
  undefined8 uVar2;
  
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
  array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
         *)this,first);
  *(undefined8 *)(this + 0x60) = 0;
  *(undefined8 *)(this + 0x68) = 0;
  paVar1 = thread_local_value<long>::local_value(dynamic_metric::g_user_metric_label_count);
  LOCK();
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  if (ylt_label_max_age != 0) {
    uVar2 = std::chrono::_V2::steady_clock::now();
    *(undefined8 *)(this + 0x68) = uVar2;
  }
  return;
}

Assistant:

metric_pair(T&& first, Args&&... args)
        : label(std::forward<T>(first)), value(std::forward<Args>(args)...) {
      g_user_metric_label_count->inc();
      if (ylt_label_max_age.count()) {
        tp = std::chrono::steady_clock::now();
      }
    }